

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O2

void Fweb(sunrealtype tcalc,N_Vector cc,N_Vector crate,UserData webdata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sunrealtype **ppsVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  sunrealtype temp;
  double dVar17;
  
  lVar10 = 0;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 1) {
    dVar14 = (double)lVar6 * webdata->dy;
    lVar1 = lVar10 + 0x140;
    lVar13 = lVar10 + -0x140;
    if (lVar6 == 0) {
      lVar13 = lVar1;
    }
    lVar12 = lVar10 + -0x140;
    if (lVar6 != 0x13) {
      lVar12 = lVar1;
    }
    for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
      dVar15 = webdata->dx;
      lVar3 = *(long *)((long)cc->content + 0x10);
      lVar8 = *(long *)((long)webdata->rates->content + 0x10);
      lVar4 = *(long *)((long)crate->content + 0x10);
      ppsVar5 = webdata->acoef;
      lVar2 = lVar3 + lVar10;
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        dVar17 = 0.0;
        for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
          dVar17 = dVar17 + *(double *)(lVar2 + lVar9 * 8) * ppsVar5[lVar7][lVar9];
        }
        *(double *)(lVar8 + (lVar6 * 0x28 + lVar11 * 2) * 8 + lVar7 * 8) = dVar17;
      }
      dVar15 = dVar15 * (double)lVar11;
      dVar17 = sin(dVar15 * 12.5663706143592);
      dVar16 = sin(dVar14 * 12.5663706143592);
      lVar8 = lVar8 + lVar10;
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        *(double *)(lVar8 + lVar7 * 8) =
             (webdata->bcoef[lVar7] * (dVar16 * dVar17 * 1000.0 + dVar15 * 50.0 * dVar14 + 1.0) +
             *(double *)(lVar8 + lVar7 * 8)) * *(double *)(lVar2 + lVar7 * 8);
      }
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        dVar15 = *(double *)(lVar2 + lVar7);
        *(double *)(lVar4 + lVar10 + lVar7) =
             ((*(double *)(lVar3 + lVar12 + lVar7) - dVar15) -
             (dVar15 - *(double *)(lVar3 + lVar13 + lVar7))) *
             *(double *)((long)webdata->coy + lVar7) +
             ((*(double *)((ulong)(lVar11 != 0x13) * 0x20 + lVar10 + lVar3 + -0x10 + lVar7) - dVar15
              ) - (dVar15 - *(double *)
                             (lVar10 + ((ulong)(lVar11 == 0) * 4 + -2) * 8 + lVar3 + lVar7))) *
             *(double *)((long)webdata->cox + lVar7) + *(double *)(lVar8 + lVar7);
      }
      lVar10 = lVar10 + 0x10;
      lVar13 = lVar13 + 0x10;
      lVar12 = lVar12 + 0x10;
    }
    lVar10 = lVar1;
  }
  return;
}

Assistant:

static void Fweb(sunrealtype tcalc, N_Vector cc, N_Vector crate, UserData webdata)
{
  sunindextype jx, jy, is, idyu, idyl, idxu, idxl;
  sunrealtype xx, yy, *cxy, *ratesxy, *cratexy, dcyli, dcyui, dcxli, dcxui;

  /* Loop over grid points, evaluate interaction vector (length ns),
     form diffusion difference terms, and load crate.                    */

  for (jy = 0; jy < MY; jy++)
  {
    yy   = (webdata->dy) * jy;
    idyu = (jy != MY - 1) ? NSMX : -NSMX;
    idyl = (jy != 0) ? NSMX : -NSMX;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = (webdata->dx) * jx;
      idxu    = (jx != MX - 1) ? NUM_SPECIES : -NUM_SPECIES;
      idxl    = (jx != 0) ? NUM_SPECIES : -NUM_SPECIES;
      cxy     = IJ_Vptr(cc, jx, jy);
      ratesxy = IJ_Vptr(webdata->rates, jx, jy);
      cratexy = IJ_Vptr(crate, jx, jy);

      /* Get interaction vector at this grid point. */
      WebRates(xx, yy, cxy, ratesxy, webdata);

      /* Loop over species, do differencing, load crate segment. */
      for (is = 0; is < NUM_SPECIES; is++)
      {
        /* Differencing in y. */
        dcyli = *(cxy + is) - *(cxy - idyl + is);
        dcyui = *(cxy + idyu + is) - *(cxy + is);

        /* Differencing in x. */
        dcxli = *(cxy + is) - *(cxy - idxl + is);
        dcxui = *(cxy + idxu + is) - *(cxy + is);

        /* Compute the crate values at (xx,yy). */
        cratexy[is] = coy[is] * (dcyui - dcyli) + cox[is] * (dcxui - dcxli) +
                      ratesxy[is];

      } /* End is loop */
    }   /* End of jx loop */
  }     /* End of jy loop */
}